

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O0

BBox<1> Omega_h::get_bounding_box<1>(Mesh *mesh)

{
  element_type *peVar1;
  double dVar2;
  BBox<1> BVar3;
  undefined1 local_a0 [32];
  int local_80;
  Int i;
  undefined1 local_70 [24];
  Mesh *mesh_local;
  BBox<1> bb;
  
  local_70._16_8_ = mesh;
  Mesh::coords((Mesh *)local_70);
  BVar3 = find_bounding_box<1>((Reals *)local_70);
  bb.min = BVar3.max.super_Few<double,_1>.array_[0];
  mesh_local = (Mesh *)BVar3.min.super_Few<double,_1>.array_[0];
  Read<double>::~Read((Read<double> *)local_70);
  for (local_80 = 0; local_80 < 1; local_80 = local_80 + 1) {
    Mesh::comm((Mesh *)(local_a0 + 0x10));
    peVar1 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(local_a0 + 0x10));
    dVar2 = Comm::allreduce<double>
                      (peVar1,(&bb.min)[(long)local_80 + -1].super_Few<double,_1>.array_[0],
                       OMEGA_H_MIN);
    (&bb.min)[(long)local_80 + -1].super_Few<double,_1>.array_[0] = dVar2;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)(local_a0 + 0x10));
    Mesh::comm((Mesh *)local_a0);
    peVar1 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
    dVar2 = Comm::allreduce<double>
                      (peVar1,(&bb.min)[local_80].super_Few<double,_1>.array_[0],OMEGA_H_MAX);
    bb.max.super_Few<double,_1>.array_[0]._4_4_ = local_80;
    (&bb.min)[local_80].super_Few<double,_1>.array_[0] = dVar2;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_a0);
  }
  BVar3.max = (Vector<1>)(Vector<1>)bb.min.super_Few<double,_1>.array_[0];
  BVar3.min.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)mesh_local;
  return BVar3;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}